

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

Array<asl::InetAddress> __thiscall asl::InetAddress::lookup(InetAddress *this,String *host)

{
  int *piVar1;
  socklen_t m;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  addrinfo *paVar7;
  addrinfo *info;
  addrinfo hints;
  InetAddress local_70;
  addrinfo *local_60;
  addrinfo local_58;
  
  Array<asl::InetAddress>::alloc((Array<asl::InetAddress> *)this,0);
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_socktype = 0;
  local_58.ai_protocol = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  uVar3 = String::indexOf(host,':',0);
  local_58.ai_family = ((int)~uVar3 >> 0x1f) * -8 + 2;
  if (host->_size == 0) {
    __name = &host->field_2;
  }
  else {
    __name = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  iVar4 = getaddrinfo(__name->_space,(char *)0x0,&local_58,&local_60);
  if (iVar4 == 0) {
    if (local_60 == (addrinfo *)0x0) {
      local_60 = (addrinfo *)0x0;
    }
    else {
      paVar7 = local_60;
      do {
        Array<unsigned_char>::alloc(&local_70._data,0);
        local_70._type = (paVar7->ai_family != 2) + IPv4;
        m = paVar7->ai_addrlen;
        Array<unsigned_char>::reserve(&local_70._data,m);
        *(socklen_t *)(local_70._data._a + -0x10) = m;
        memcpy(local_70._data._a,paVar7->ai_addr,(ulong)paVar7->ai_addrlen);
        puVar2 = (this->_data)._a;
        if (0 < (long)*(int *)(puVar2 + -0x10)) {
          lVar5 = 0;
          do {
            if (*(Type *)(puVar2 + lVar5 * 0x10 + 8) == local_70._type) {
              uVar3 = *(uint *)(*(long *)(puVar2 + lVar5 * 0x10) + -0x10);
              if (uVar3 == *(uint *)(local_70._data._a + -0x10)) {
                if ((int)uVar3 < 1) goto LAB_0011cc37;
                uVar6 = 0;
                while (local_70._data._a[uVar6] ==
                       *(uchar *)(*(long *)(puVar2 + lVar5 * 0x10) + uVar6)) {
                  uVar6 = uVar6 + 1;
                  if (uVar3 == uVar6) goto LAB_0011cc37;
                }
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != *(int *)(puVar2 + -0x10));
        }
        Array<asl::InetAddress>::insert
                  ((Array<asl::InetAddress> *)this,-(uint)(local_70._type != IPv4),&local_70);
LAB_0011cc37:
        LOCK();
        piVar1 = (int *)(local_70._data._a + -8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          free(local_70._data._a + -0x10);
        }
        paVar7 = paVar7->ai_next;
      } while (paVar7 != (addrinfo *)0x0);
    }
    freeaddrinfo(local_60);
  }
  return (Array<asl::InetAddress>)this;
}

Assistant:

Array<InetAddress> InetAddress::lookup(const String& host)
{
#ifdef _WIN32
	if (!g_wsaStarted) startWSA();
#endif
	Array<InetAddress> addresses;
	addrinfo hints;
	addrinfo* info;
	memset(&hints, 0, sizeof(addrinfo));
	hints.ai_family = host.contains(':') ? AF_INET6 : AF_TYPE;

	int s = getaddrinfo(host, NULL, &hints, &info);
	if (s != 0)
	{
		verbose_print("Cannot resolve %s\n", *host);
		return addresses;
	}
	for (const addrinfo* ai = info; ai; ai = ai->ai_next)
	{
		InetAddress a;
		if (ai->ai_family == AF_INET)
			a._type = IPv4;
		else
			a._type = IPv6;
		a.resize((int)ai->ai_addrlen);
		memcpy(a.ptr(), ai->ai_addr, ai->ai_addrlen);
		if (!addresses.contains(a))
		{
			if (a._type == IPv4)
				addresses.insert(0, a);
			else
				addresses << a;
		}
	}
	freeaddrinfo(info);
	return addresses;
}